

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformpixmap.cpp
# Opt level: O2

bool __thiscall
QPlatformPixmap::fromFile
          (QPlatformPixmap *this,QString *fileName,char *format,ImageConversionFlags flags)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  size_t __nbytes;
  void *__buf;
  byte bVar2;
  long in_FS_OFFSET;
  QImage local_90;
  QArrayDataPointer<char> local_78;
  QImageReader local_60;
  undefined1 local_58 [16];
  QImageData *local_48;
  long local_38;
  
  __nbytes = CONCAT44(in_register_0000000c,
                      flags.super_QFlagsStorageHelper<Qt::ImageConversionFlag,_4>.
                      super_QFlagsStorage<Qt::ImageConversionFlag>.i);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_78,format,-1);
  QImageReader::QImageReader(&local_60,fileName,(QByteArray *)&local_78);
  QImageReader::read((QImageReader *)local_58,(int)&local_60,__buf,__nbytes);
  QImageReader::~QImageReader(&local_60);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  bVar1 = QImage::isNull((QImage *)local_58);
  if (bVar1) {
    bVar2 = 0;
  }
  else {
    QImage::QImage(&local_90,(QImage *)local_58);
    makeBitmapCompliantIfNeeded((QImage *)&local_78,this,&local_90,flags);
    (*this->_vptr_QPlatformPixmap[4])
              (this,&local_78,
               (ulong)(uint)flags.super_QFlagsStorageHelper<Qt::ImageConversionFlag,_4>.
                            super_QFlagsStorage<Qt::ImageConversionFlag>.i);
    QImage::~QImage((QImage *)&local_78);
    QImage::~QImage(&local_90);
    bVar2 = this->is_null ^ 1;
  }
  QImage::~QImage((QImage *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QPlatformPixmap::fromFile(const QString &fileName, const char *format,
                           Qt::ImageConversionFlags flags)
{
    QImage image = QImageReader(fileName, format).read();
    if (image.isNull())
        return false;
    fromImage(makeBitmapCompliantIfNeeded(this, std::move(image), flags), flags);
    return !isNull();
}